

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllTypes.cpp
# Opt level: O3

void __thiscall
slang::ast::PredefinedIntegerType::PredefinedIntegerType
          (PredefinedIntegerType *this,Kind integerKind,bool isSigned)

{
  bitwidth_t bVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  
  lVar4 = (long)(int)integerKind;
  bVar1 = *(bitwidth_t *)(&DAT_0053f5a8 + lVar4 * 4);
  sVar3 = *(size_t *)(&DAT_0053f5c0 + lVar4 * 8);
  iVar2 = *(int *)(&DAT_0053f5f0 + lVar4 * 4);
  (this->super_IntegralType).super_Type.super_Symbol.kind = PredefinedIntegerType;
  (this->super_IntegralType).super_Type.super_Symbol.name._M_len = sVar3;
  (this->super_IntegralType).super_Type.super_Symbol.name._M_str = &DAT_0053f5f0 + iVar2;
  (this->super_IntegralType).super_Type.super_Symbol.originatingSyntax = (SyntaxNode *)0x0;
  (this->super_IntegralType).super_Type.super_Symbol.location = (SourceLocation)0x0;
  (this->super_IntegralType).super_Type.super_Symbol.parentScope = (Scope *)0x0;
  *(undefined8 *)((long)&(this->super_IntegralType).super_Type.super_Symbol.parentScope + 4) = 0;
  *(undefined8 *)((long)&(this->super_IntegralType).super_Type.super_Symbol.nextInScope + 4) = 0;
  (this->super_IntegralType).super_Type.canonical = (Type *)this;
  (this->super_IntegralType).bitWidth = bVar1;
  (this->super_IntegralType).isSigned = isSigned;
  (this->super_IntegralType).isFourState =
       SUB81(0x10100000000 >> ((char)integerKind * '\b' & 0x3fU),0);
  this->integerKind = integerKind;
  return;
}

Assistant:

std::string_view getName(PredefinedIntegerType::Kind kind) {
    switch (kind) {
        case PredefinedIntegerType::ShortInt: return "shortint"sv;
        case PredefinedIntegerType::Int: return "int"sv;
        case PredefinedIntegerType::LongInt: return "longint"sv;
        case PredefinedIntegerType::Byte: return "byte"sv;
        case PredefinedIntegerType::Integer: return "integer"sv;
        case PredefinedIntegerType::Time: return "time"sv;
    }
    SLANG_UNREACHABLE;
}